

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O0

bool __thiscall SubprocessSet::DoWork(SubprocessSet *this,TokenPool *tokens)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  reference ppSVar4;
  const_iterator cStack_f8;
  int fd_3;
  Subprocess **local_f0;
  int local_e4;
  iterator iStack_e0;
  int fd_2;
  __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
  local_d8;
  iterator i_1;
  int ret;
  int fd_1;
  int fd;
  __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
  local_b8;
  iterator i;
  fd_set *__arr;
  uint __i;
  int nfds;
  fd_set set;
  TokenPool *tokens_local;
  SubprocessSet *this_local;
  
  __arr._4_4_ = 0;
  i._M_current = (Subprocess **)&__i;
  for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
    i._M_current[(uint)__arr] = (Subprocess *)0x0;
  }
  set.fds_bits[0xf] = (__fd_mask)tokens;
  local_b8._M_current =
       (Subprocess **)
       std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::begin(&this->running_);
  while( true ) {
    _fd_1 = std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::end(&this->running_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_b8,
                       (__normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
                        *)&fd_1);
    if (!bVar1) break;
    ppSVar4 = __gnu_cxx::
              __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
              ::operator*(&local_b8);
    iVar2 = (*ppSVar4)->fd_;
    if ((-1 < iVar2) &&
       (*(ulong *)(&__i + (long)(iVar2 / 0x40) * 2) =
             1L << ((byte)((long)iVar2 % 0x40) & 0x3f) | *(ulong *)(&__i + (long)(iVar2 / 0x40) * 2)
       , __arr._4_4_ < iVar2 + 1)) {
      __arr._4_4_ = iVar2 + 1;
    }
    __gnu_cxx::
    __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>::
    operator++(&local_b8);
  }
  if (set.fds_bits[0xf] != 0) {
    iVar2 = (**(code **)(*(long *)set.fds_bits[0xf] + 0x38))();
    *(ulong *)(&__i + (long)(iVar2 / 0x40) * 2) =
         1L << ((byte)((long)iVar2 % 0x40) & 0x3f) | *(ulong *)(&__i + (long)(iVar2 / 0x40) * 2);
    if (__arr._4_4_ < iVar2 + 1) {
      __arr._4_4_ = iVar2 + 1;
    }
  }
  interrupted_ = 0;
  i_1._M_current._4_4_ =
       pselect(__arr._4_4_,(fd_set *)&__i,(fd_set *)0x0,(fd_set *)0x0,(timespec *)0x0,
               (__sigset_t *)&this->old_mask_);
  if (i_1._M_current._4_4_ == -1) {
    piVar3 = __errno_location();
    if (*piVar3 == 4) {
      this_local._7_1_ = IsInterrupted();
    }
    else {
      perror("ninja: pselect");
      this_local._7_1_ = false;
    }
  }
  else {
    HandlePendingInterruption();
    bVar1 = IsInterrupted();
    if (!bVar1) {
      local_d8._M_current =
           (Subprocess **)
           std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::begin(&this->running_);
      do {
        while( true ) {
          iStack_e0 = std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::end(&this->running_)
          ;
          bVar1 = __gnu_cxx::operator!=(&local_d8,&stack0xffffffffffffff20);
          if (!bVar1) {
            if (((set.fds_bits[0xf] != 0) &&
                (iVar2 = (**(code **)(*(long *)set.fds_bits[0xf] + 0x38))(), -1 < iVar2)) &&
               ((*(ulong *)(&__i + (long)(iVar2 / 0x40) * 2) &
                1L << ((byte)((long)iVar2 % 0x40) & 0x3f)) != 0)) {
              this->token_available_ = true;
            }
            bVar1 = IsInterrupted();
            return bVar1;
          }
          ppSVar4 = __gnu_cxx::
                    __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
                    ::operator*(&local_d8);
          local_e4 = (*ppSVar4)->fd_;
          if ((-1 < local_e4) &&
             ((*(ulong *)(&__i + (long)(local_e4 / 0x40) * 2) &
              1L << ((byte)((long)local_e4 % 0x40) & 0x3f)) != 0)) break;
LAB_0022ba90:
          __gnu_cxx::
          __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
          ::operator++(&local_d8);
        }
        ppSVar4 = __gnu_cxx::
                  __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
                  ::operator*(&local_d8);
        Subprocess::OnPipeReady(*ppSVar4);
        ppSVar4 = __gnu_cxx::
                  __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
                  ::operator*(&local_d8);
        bVar1 = Subprocess::Done(*ppSVar4);
        if (!bVar1) goto LAB_0022ba90;
        ppSVar4 = __gnu_cxx::
                  __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
                  ::operator*(&local_d8);
        std::queue<Subprocess_*,_std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>_>::push
                  (&this->finished_,ppSVar4);
        __gnu_cxx::
        __normal_iterator<Subprocess*const*,std::vector<Subprocess*,std::allocator<Subprocess*>>>::
        __normal_iterator<Subprocess**>
                  ((__normal_iterator<Subprocess*const*,std::vector<Subprocess*,std::allocator<Subprocess*>>>
                    *)&stack0xffffffffffffff08,&local_d8);
        local_f0 = (Subprocess **)
                   std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::erase
                             (&this->running_,cStack_f8);
        local_d8._M_current = local_f0;
      } while( true );
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SubprocessSet::DoWork(TokenPool* tokens) {
  fd_set set;
  int nfds = 0;
  FD_ZERO(&set);

  for (vector<Subprocess*>::iterator i = running_.begin();
       i != running_.end(); ++i) {
    int fd = (*i)->fd_;
    if (fd >= 0) {
      FD_SET(fd, &set);
      if (nfds < fd+1)
        nfds = fd+1;
    }
  }

  if (tokens) {
    int fd = tokens->GetMonitorFd();
    FD_SET(fd, &set);
    if (nfds < fd+1)
      nfds = fd+1;
  }

  interrupted_ = 0;
  int ret = pselect(nfds, &set, 0, 0, 0, &old_mask_);
  if (ret == -1) {
    if (errno != EINTR) {
      perror("ninja: pselect");
      return false;
    }
    return IsInterrupted();
  }

  HandlePendingInterruption();
  if (IsInterrupted())
    return true;

  for (vector<Subprocess*>::iterator i = running_.begin();
       i != running_.end(); ) {
    int fd = (*i)->fd_;
    if (fd >= 0 && FD_ISSET(fd, &set)) {
      (*i)->OnPipeReady();
      if ((*i)->Done()) {
        finished_.push(*i);
        i = running_.erase(i);
        continue;
      }
    }
    ++i;
  }

  if (tokens) {
    int fd = tokens->GetMonitorFd();
    if ((fd >= 0) && FD_ISSET(fd, &set))
    token_available_ = true;
  }

  return IsInterrupted();
}